

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

SRes crnlib::LzmaEncode(Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,CLzmaEncProps *props,
                       Byte *propsEncoded,SizeT *propsSize,int writeEndMark,
                       ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  SRes SVar1;
  CLzmaEncHandle pp;
  
  pp = LzmaEnc_Create(alloc);
  if (pp == (CLzmaEncHandle)0x0) {
    SVar1 = 2;
  }
  else {
    SVar1 = LzmaEnc_SetProps(pp,props);
    if ((SVar1 == 0) && (SVar1 = LzmaEnc_WriteProperties(pp,propsEncoded,propsSize), SVar1 == 0)) {
      SVar1 = LzmaEnc_MemEncode(pp,dest,destLen,src,srcLen,writeEndMark,progress,alloc,allocBig);
    }
    LzmaEnc_Destroy(pp,alloc,allocBig);
  }
  return SVar1;
}

Assistant:

SRes LzmaEncode(Byte* dest, SizeT* destLen, const Byte* src, SizeT srcLen,
                const CLzmaEncProps* props, Byte* propsEncoded, SizeT* propsSize, int writeEndMark,
                ICompressProgress* progress, ISzAlloc* alloc, ISzAlloc* allocBig) {
  CLzmaEnc* p = (CLzmaEnc*)LzmaEnc_Create(alloc);
  SRes res;
  if (p == 0)
    return SZ_ERROR_MEM;

  res = LzmaEnc_SetProps(p, props);
  if (res == SZ_OK) {
    res = LzmaEnc_WriteProperties(p, propsEncoded, propsSize);
    if (res == SZ_OK)
      res = LzmaEnc_MemEncode(p, dest, destLen, src, srcLen,
                              writeEndMark, progress, alloc, allocBig);
  }

  LzmaEnc_Destroy(p, alloc, allocBig);
  return res;
}